

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Epnp.cpp
# Opt level: O1

void __thiscall opengv::absolute_pose::modules::Epnp::choose_control_points(Epnp *this)

{
  double (*padVar1) [3];
  undefined1 auVar2 [16];
  int iVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double *pdVar11;
  long lVar12;
  ulong uVar13;
  ulong *puVar14;
  Index index;
  long lVar15;
  double *pdVar16;
  ulong uVar17;
  ActualDstType actualDst;
  int j;
  long lVar18;
  double *pdVar19;
  int j_1;
  double (*padVar20) [3];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  MatrixXd D;
  MatrixXd PW0;
  MatrixXd Ut;
  MatrixXd PW0tPW0;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> SVD;
  DenseStorage<double,__1,__1,__1,_0> local_2b8;
  DenseStorage<double,__1,__1,__1,_0> local_298;
  long local_280;
  long local_278;
  MatrixType local_268;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> *local_250;
  JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2> local_248;
  undefined1 extraout_var [56];
  
  padVar1 = this->cws;
  this->cws[0][0] = 0.0;
  this->cws[0][1] = 0.0;
  this->cws[0][2] = 0.0;
  iVar3 = this->number_of_correspondences;
  lVar15 = (long)iVar3;
  if (0 < lVar15) {
    pdVar11 = this->pws;
    lVar12 = 0;
    do {
      lVar18 = 0;
      do {
        (*padVar1)[lVar18] = pdVar11[lVar18] + (*padVar1)[lVar18];
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
      lVar12 = lVar12 + 1;
      pdVar11 = pdVar11 + 3;
    } while (lVar12 != lVar15);
  }
  auVar25._0_8_ = (double)iVar3;
  auVar25._8_8_ = auVar25._0_8_;
  auVar25._16_8_ = auVar25._0_8_;
  auVar25._24_8_ = auVar25._0_8_;
  auVar21 = vdivpd_avx(*(undefined1 (*) [32])this->cws,auVar25);
  auVar21._24_8_ = this->cws[1][0];
  *(undefined1 (*) [32])padVar1 = auVar21;
  local_298.m_data = (double *)0x0;
  local_298.m_rows = 0;
  local_298.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_298,lVar15 * 3,lVar15,3);
  iVar3 = this->number_of_correspondences;
  if (0 < (long)iVar3) {
    pdVar11 = this->pws;
    lVar15 = 0;
    pdVar16 = local_298.m_data;
    do {
      lVar12 = 0;
      pdVar19 = pdVar16;
      do {
        *pdVar19 = pdVar11[lVar12] - (*padVar1)[lVar12];
        lVar12 = lVar12 + 1;
        pdVar19 = pdVar19 + local_298.m_rows;
      } while (lVar12 != 3);
      lVar15 = lVar15 + 1;
      pdVar11 = pdVar11 + 3;
      pdVar16 = pdVar16 + 1;
    } while (lVar15 != iVar3);
  }
  local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)&local_298;
  local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.m_matrixU.
  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       (Index)&local_298;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_268,
             (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>_>
              *)&local_248);
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::JacobiSVD
            (&local_248,&local_268,0x14);
  local_2b8.m_data = (double *)0x0;
  local_2b8.m_rows = 0;
  local_2b8.m_cols = 0;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_2b8,
             local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,
             local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>
             .m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
             m_storage.m_rows,1);
  if ((local_2b8.m_rows !=
       local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
       m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_rows) || (local_2b8.m_cols != 1)) {
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              (&local_2b8,
               local_248.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,
               local_248.
               super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
               m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_rows,1);
  }
  uVar13 = local_2b8.m_cols * local_2b8.m_rows;
  uVar17 = uVar13 + 7;
  if (-1 < (long)uVar13) {
    uVar17 = uVar13;
  }
  uVar17 = uVar17 & 0xfffffffffffffff8;
  if (7 < (long)uVar13) {
    lVar15 = 0;
    do {
      pdVar11 = local_248.
                super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
                m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                m_storage.m_data + lVar15;
      dVar4 = pdVar11[1];
      dVar5 = pdVar11[2];
      dVar6 = pdVar11[3];
      dVar7 = pdVar11[4];
      dVar8 = pdVar11[5];
      dVar9 = pdVar11[6];
      dVar10 = pdVar11[7];
      pdVar16 = local_2b8.m_data + lVar15;
      *pdVar16 = *pdVar11;
      pdVar16[1] = dVar4;
      pdVar16[2] = dVar5;
      pdVar16[3] = dVar6;
      pdVar16[4] = dVar7;
      pdVar16[5] = dVar8;
      pdVar16[6] = dVar9;
      pdVar16[7] = dVar10;
      lVar15 = lVar15 + 8;
    } while (lVar15 < (long)uVar17);
  }
  if ((long)uVar17 < (long)uVar13) {
    do {
      local_2b8.m_data[uVar17] =
           local_248.super_SVDBase<Eigen::JacobiSVD<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_2>_>.
           m_singularValues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
           .m_data[uVar17];
      uVar17 = uVar17 + 1;
    } while (uVar13 - uVar17 != 0);
  }
  local_250 = &local_248;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>const>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_280,
             (DenseBase<Eigen::Transpose<const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_> *)
             &local_250);
  padVar20 = this->cws;
  lVar15 = 1;
  lVar12 = 0;
  do {
    padVar20 = padVar20 + 1;
    auVar22._0_8_ = local_2b8.m_data[lVar15 + -1] / (double)this->number_of_correspondences;
    auVar22._8_8_ = 0;
    if (auVar22._0_8_ < 0.0) {
      auVar23._0_8_ = sqrt(auVar22._0_8_);
      auVar23._8_56_ = extraout_var;
      auVar22 = auVar23._0_16_;
    }
    else {
      auVar22 = vsqrtsd_avx(auVar22,auVar22);
    }
    puVar14 = (ulong *)(local_280 + lVar12);
    lVar18 = 0;
    do {
      auVar24._8_8_ = 0;
      auVar24._0_8_ = *puVar14;
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (*padVar1)[lVar18];
      auVar2 = vfmadd213sd_fma(auVar24,auVar22,auVar2);
      (*padVar20)[lVar18] = auVar2._0_8_;
      lVar18 = lVar18 + 1;
      puVar14 = puVar14 + local_278;
    } while (lVar18 != 3);
    lVar15 = lVar15 + 1;
    lVar12 = lVar12 + 8;
  } while (lVar15 != 4);
  if (local_280 != 0) {
    free(*(void **)(local_280 + -8));
  }
  if (local_2b8.m_data != (double *)0x0) {
    free((void *)local_2b8.m_data[-1]);
  }
  Eigen::JacobiSVD<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_2>::~JacobiSVD(&local_248);
  if (local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data !=
      (double *)0x0) {
    free((void *)local_268.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                 m_storage.m_data[-1]);
  }
  if (local_298.m_data != (double *)0x0) {
    free((void *)local_298.m_data[-1]);
  }
  return;
}

Assistant:

void
opengv::absolute_pose::modules::Epnp::choose_control_points(void)
{
  // Take C0 as the reference points centroid:
  cws[0][0] = cws[0][1] = cws[0][2] = 0;
  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      cws[0][j] += pws[3 * i + j];

  for(int j = 0; j < 3; j++)
    cws[0][j] /= number_of_correspondences;


  // Take C1, C2, and C3 from PCA on the reference points:
  Eigen::MatrixXd PW0(number_of_correspondences,3);

  for(int i = 0; i < number_of_correspondences; i++)
    for(int j = 0; j < 3; j++)
      PW0(i,j) = pws[3 * i + j] - cws[0][j];

  Eigen::MatrixXd PW0tPW0 = PW0.transpose() * PW0;
  Eigen::JacobiSVD< Eigen::MatrixXd > SVD(
      PW0tPW0,
      Eigen::ComputeFullV | Eigen::ComputeFullU );
  Eigen::MatrixXd D = SVD.singularValues();
  Eigen::MatrixXd Ut = SVD.matrixU().transpose();

  for(int i = 1; i < 4; i++)
  {
    double k = sqrt(D(i - 1,0) / number_of_correspondences);
    for(int j = 0; j < 3; j++)
      cws[i][j] = cws[0][j] + k * Ut((i - 1),j);
  }
}